

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmParseTree.cpp
# Opt level: O1

char16 * Wasm::WasmTypes::GetTypeName(WasmType type)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char16_t *pcVar4;
  
  switch(type) {
  case Void:
    pcVar4 = L"void";
    break;
  case FirstLocalType:
    pcVar4 = L"i32";
    break;
  case I64:
    pcVar4 = L"i64";
    break;
  case F32:
    pcVar4 = L"f32";
    break;
  case F64:
    pcVar4 = L"f64";
    break;
  case V128:
    Simd::EnsureSimdIsEnabled();
    pcVar4 = L"m128";
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmParseTree.cpp"
                       ,0x7f,"((0))","UNREACHED");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pcVar4 = L"unknown";
    break;
  case Any:
    pcVar4 = L"any";
  }
  return pcVar4;
}

Assistant:

const char16 * GetTypeName(WasmType type)
{
    switch (type) {
    case WasmTypes::WasmType::Void: return _u("void");
    case WasmTypes::WasmType::I32: return _u("i32");
    case WasmTypes::WasmType::I64: return _u("i64");
    case WasmTypes::WasmType::F32: return _u("f32");
    case WasmTypes::WasmType::F64: return _u("f64");
#ifdef ENABLE_WASM_SIMD
    case WasmTypes::WasmType::V128: 
        Simd::EnsureSimdIsEnabled();
        return _u("m128");
#endif
    case WasmTypes::WasmType::Any: return _u("any");
    default: Assert(UNREACHED); break;
    }
    return _u("unknown");
}